

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void monty_free(MontyContext *mc)

{
  long lVar1;
  
  mp_free(mc->m);
  lVar1 = 5;
  do {
    mp_free(mc->powers_of_r_mod_m[lVar1 + -5]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  mp_free(mc->minus_minv_mod_r);
  mp_free(mc->scratch);
  smemclr(mc,0x48);
  safefree(mc);
  return;
}

Assistant:

void monty_free(MontyContext *mc)
{
    mp_free(mc->m);
    for (size_t j = 0; j < 3; j++)
        mp_free(mc->powers_of_r_mod_m[j]);
    mp_free(mc->minus_minv_mod_r);
    mp_free(mc->scratch);
    smemclr(mc, sizeof(*mc));
    sfree(mc);
}